

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

int yang_check_sub_module(lys_module *module,unres_schema *unres,lys_node *node)

{
  lys_ext_instance ***ext;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined2 uVar4;
  lys_revision *plVar5;
  lys_ext *plVar6;
  lys_feature *plVar7;
  lys_deviation *plVar8;
  lys_type *plVar9;
  undefined8 uVar10;
  lys_ext_instance **pplVar11;
  lys_tpdf *plVar12;
  lys_restr *plVar13;
  bool bVar14;
  lys_node *dev_target_00;
  unres_schema *puVar15;
  uint8_t uVar16;
  int iVar17;
  uint uVar18;
  lys_module *plVar19;
  lys_node *plVar20;
  lys_module *plVar21;
  LY_ERR *pLVar22;
  char *pcVar23;
  lys_node *plVar24;
  uint index;
  ulong uVar25;
  ly_set *plVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  bool bVar31;
  unres_schema local_a8;
  lys_type *local_80;
  ulong local_78;
  lys_node *local_70;
  char *local_68;
  lys_module *local_60;
  lys_node *local_58;
  lys_node *dev_target;
  ly_set *local_48;
  unres_schema *local_40;
  lys_node *local_38;
  
  bVar1 = module->augment_size;
  uVar27 = (ulong)bVar1;
  bVar2 = module->deviation_size;
  uVar29 = (ulong)bVar2;
  module->augment_size = '\0';
  module->deviation_size = '\0';
  local_70 = node;
  iVar17 = yang_check_typedef(module,(lys_node *)0x0,unres);
  bVar31 = false;
  bVar14 = false;
  if (iVar17 == 0) {
    iVar17 = yang_check_ext_instance(module,&module->ext,(uint)module->ext_size,module,unres);
    if (iVar17 == 0) {
      local_40 = unres;
      if (module->rev_size != '\0') {
        lVar28 = 0x10;
        uVar25 = 0;
        do {
          plVar5 = module->rev;
          iVar17 = yang_check_ext_instance
                             (module,(lys_ext_instance ***)(plVar5->date + lVar28),
                              (uint)(byte)plVar5->date[lVar28 + -5],plVar5->date + lVar28 + -0x10,
                              local_40);
          if (iVar17 != 0) goto LAB_00151b3e;
          uVar25 = uVar25 + 1;
          lVar28 = lVar28 + 0x28;
        } while (uVar25 < module->rev_size);
      }
      if (module->extensions_size != '\0') {
        lVar28 = 0x20;
        uVar25 = 0;
        do {
          plVar6 = module->extensions;
          iVar17 = yang_check_ext_instance
                             (module,(lys_ext_instance ***)(plVar6->padding + lVar28 + -0x1b),
                              (uint)plVar6->padding[lVar28 + -0x21],plVar6->padding + lVar28 + -0x3b
                              ,local_40);
          if (iVar17 != 0) goto LAB_00151b3e;
          uVar25 = uVar25 + 1;
          lVar28 = lVar28 + 0x40;
        } while (uVar25 < module->extensions_size);
      }
      if (module->features_size != '\0') {
        lVar28 = 0;
        plVar20 = (lys_node *)0x0;
        do {
          puVar15 = local_40;
          local_38 = plVar20;
          iVar17 = yang_check_iffeatures
                             (module,(void *)0x0,module->features->padding + lVar28 + -0x1c,
                              FEATURE_KEYWORD,local_40);
          if (iVar17 != 0) {
LAB_00151d34:
            bVar14 = false;
            bVar31 = false;
            goto LAB_00151b43;
          }
          plVar7 = module->features;
          iVar17 = yang_check_ext_instance
                             (module,(lys_ext_instance ***)(plVar7->padding + lVar28 + 4),
                              (uint)plVar7->padding[lVar28 + -2],plVar7->padding + lVar28 + -0x1c,
                              puVar15);
          plVar20 = local_38;
          if (iVar17 != 0) goto LAB_00151b3e;
          if ((module->features->padding[lVar28 + -1] != '\0') &&
             (iVar17 = unres_schema_add_node
                                 (module,local_40,module->features->padding + lVar28 + -0x1c,
                                  UNRES_FEATURE,(lys_node *)0x0), iVar17 == -1)) goto LAB_00151d34;
          plVar20 = (lys_node *)((long)&plVar20->name + 1);
          lVar28 = lVar28 + 0x40;
        } while (plVar20 < (lys_node *)(ulong)module->features_size);
      }
      puVar15 = local_40;
      iVar17 = yang_check_identities(module,local_40);
      if (iVar17 == 0) {
        iVar17 = yang_check_nodes(module,(lys_node *)0x0,local_70,0,puVar15);
        bVar31 = true;
        if (iVar17 == 0) {
          if (uVar29 != 0) {
            uVar25 = 0;
            do {
              module->deviation_size = module->deviation_size + '\x01';
              plVar8 = module->deviation;
              dev_target = (lys_node *)(plVar8 + uVar25);
              local_58 = (lys_node *)0x0;
              local_78 = uVar25;
              local_48 = ly_set_new();
              iVar17 = resolve_augment_schema_nodeid
                                 (plVar8[uVar25].target_name,(lys_node *)0x0,module,1,&local_58);
              if ((iVar17 != 0) || (local_58 == (lys_node *)0x0)) {
                ly_vlog(LYE_INARG,LY_VLOG_NONE,(void *)0x0,dev_target->name,"deviation");
                plVar26 = local_48;
LAB_00152412:
                ly_set_free(plVar26);
                goto LAB_0015241a;
              }
              plVar21 = local_58->module;
              plVar19 = lys_main_module(module);
              plVar26 = local_48;
              if (plVar21 == plVar19) {
                ly_vlog(LYE_INARG,LY_VLOG_NONE,(void *)0x0,dev_target->name,"deviation");
                ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Deviating own module is not allowed.");
                plVar26 = local_48;
                goto LAB_00152412;
              }
              if (local_48 == (ly_set *)0x0) {
                pLVar22 = ly_errno_location();
                *pLVar22 = LY_EMEM;
                ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_check_deviation");
                goto LAB_00152412;
              }
              if (*(int *)&dev_target->iffeature->expr == 0) {
                if ((((local_58->nodetype == LYS_LEAF) &&
                     (plVar20 = local_58->parent, plVar20 != (lys_node *)0x0)) &&
                    (plVar20->nodetype == LYS_LIST)) && ((ulong)plVar20->padding[2] != 0)) {
                  uVar25 = 0;
                  do {
                    if (*(lys_node **)(*(long *)&plVar20[1].flags + uVar25 * 8) == local_58) {
                      ly_vlog(LYE_INARG,LY_VLOG_NONE,(void *)0x0,"not-supported","deviation");
                      ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                              "\"not-supported\" deviation cannot remove a list key.");
                      goto LAB_00152412;
                    }
                    uVar25 = uVar25 + 1;
                  } while (plVar20->padding[2] != uVar25);
                }
                lys_node_unlink(local_58);
                *(lys_node **)&dev_target->flags = local_58;
              }
              else {
                local_a8.str_snode = (void **)0x0;
                local_a8.module = (lys_module **)0x0;
                local_a8.item = (void **)0x0;
                local_a8.type = (UNRES_ITEM *)0x0;
                local_a8.count = 0;
                local_a8._36_4_ = 0;
                plVar20 = lys_node_dup(local_58->module,(lys_node *)0x0,local_58,&local_a8,1);
                *(lys_node **)&dev_target->flags = plVar20;
                if (local_a8.count != 0) {
                  pLVar22 = ly_errno_location();
                  *pLVar22 = LY_EINT;
                  ly_log(LY_LLERR,"Internal error (%s:%d).",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_yang.c"
                         ,0x1160);
                  goto LAB_00152412;
                }
              }
              plVar20 = dev_target;
              iVar17 = yang_check_ext_instance
                                 (module,(lys_ext_instance ***)&dev_target->module,
                                  (uint)*(byte *)((long)&dev_target->ext + 1),dev_target,local_40);
              if (iVar17 != 0) goto LAB_00152412;
              if (*(char *)&plVar20->ext != '\0') {
                pcVar23 = (char *)0x0;
                do {
                  dev_target_00 = local_58;
                  plVar24 = (lys_node *)((long)plVar20->iffeature + (long)pcVar23 * 0x48);
                  ext = (lys_ext_instance ***)
                        ((long)plVar20->iffeature + (long)pcVar23 * 0x48 + 0x40);
                  local_68 = pcVar23;
                  iVar17 = yang_check_ext_instance
                                     (module,ext,(uint)*(byte *)((long)ext + -0x3a),plVar24,local_40
                                     );
                  if (((iVar17 != 0) ||
                      ((local_38 = plVar24, *(uint8_t *)((long)&plVar24->dsc + 1) != '\0' &&
                       (iVar17 = yang_check_deviate_must
                                           (module,local_40,(lys_deviate *)plVar24,dev_target_00),
                       plVar24 = local_38, iVar17 != 0)))) ||
                     ((local_38->ext != (lys_ext_instance **)0x0 &&
                      (iVar17 = yang_check_deviate_unique
                                          (module,(lys_deviate *)local_38,dev_target_00),
                      plVar24 = local_38, iVar17 != 0)))) {
LAB_001523d8:
                    if ((lys_type *)plVar24->iffeature != (lys_type *)0x0) {
                      yang_type_free(module->ctx,(lys_type *)plVar24->iffeature);
                      plVar24->iffeature = (lys_iffeature *)0x0;
                    }
                    plVar20 = dev_target;
                    index = (int)local_68 + 1;
                    yang_free_deviate(module->ctx,(lys_deviation *)dev_target,index);
                    *(char *)&plVar20->ext = (char)index;
                    plVar26 = local_48;
                    goto LAB_00152412;
                  }
                  if (*(char *)((long)&local_38->name + 5) != '\0') {
                    iVar17 = yang_read_deviate_default
                                       (module,(lys_deviate *)local_38,dev_target_00,local_48);
                    plVar24 = local_38;
                    if (iVar17 != 0) goto LAB_001523d8;
                    if ((dev_target_00->nodetype == LYS_LEAFLIST) &&
                       (*(LYS_DEVIATE_TYPE *)&local_38->name == LY_DEVIATE_DEL)) {
                      bVar3 = dev_target_00->padding[2];
                      if ((ulong)bVar3 == 0) {
                        uVar16 = '\x01';
                      }
                      else {
                        uVar25 = 0;
                        uVar18 = 0;
                        do {
                          *(undefined8 *)
                           ((dev_target_00[1].prev)->padding + (ulong)uVar18 * 8 + -0x1c) =
                               *(undefined8 *)
                                ((dev_target_00[1].prev)->padding + uVar25 * 8 + -0x1c);
                          uVar18 = (uVar18 + 1) -
                                   (uint)(*(long *)((dev_target_00[1].prev)->padding +
                                                   (ulong)uVar18 * 8 + -0x1c) == 0);
                          uVar25 = uVar25 + 1;
                        } while (bVar3 != uVar25);
                        uVar16 = (char)uVar18 + '\x01';
                      }
                      dev_target_00->padding[2] = uVar16;
                    }
                  }
                  if ((((*(char *)&local_38->dsc != '\0') &&
                       (iVar17 = yang_read_deviate_minmax
                                           ((lys_deviate *)local_38,dev_target_00,
                                            *(uint32_t *)&local_38->ref,1), plVar24 = local_38,
                       iVar17 != 0)) ||
                      ((*(char *)((long)&local_38->name + 7) != '\0' &&
                       (iVar17 = yang_read_deviate_minmax
                                           ((lys_deviate *)local_38,dev_target_00,
                                            *(uint32_t *)((long)&local_38->dsc + 4),0),
                       plVar24 = local_38, iVar17 != 0)))) ||
                     ((local_38->module != (lys_module *)0x0 &&
                      (iVar17 = yang_read_deviate_units
                                          (module->ctx,(lys_deviate *)local_38,dev_target_00),
                      plVar24 = local_38, iVar17 != 0)))) goto LAB_001523d8;
                  bVar3 = *(byte *)((long)&local_38->name + 4);
                  if ((bVar3 & 3) != 0) {
                    uVar4 = dev_target_00->flags;
                    dev_target_00->flags = bVar3 & 3 | uVar4 & 0xfffc;
                  }
                  if ((0x3f < bVar3) &&
                     (iVar17 = yang_check_deviate_mandatory((lys_deviate *)local_38,dev_target_00),
                     plVar24 = local_38, iVar17 != 0)) goto LAB_001523d8;
                  if ((lys_type *)local_38->iffeature != (lys_type *)0x0) {
                    if ((dev_target_00->nodetype == LYS_LEAF) ||
                       (dev_target_00->nodetype == LYS_LEAFLIST)) {
                      local_80 = (lys_type *)&dev_target_00[1].ref;
                      local_60 = dev_target_00[1].module;
                      lys_type_free(module->ctx,local_80);
                      plVar24 = local_38;
                      plVar9 = (lys_type *)local_38->iffeature;
                      pcVar23 = plVar9->module_name;
                      uVar10._0_4_ = plVar9->base;
                      uVar10._4_1_ = plVar9->ext_size;
                      uVar10._5_3_ = *(undefined3 *)&plVar9->field_0xd;
                      pplVar11 = plVar9->ext;
                      plVar12 = plVar9->der;
                      plVar21 = (lys_module *)plVar9->parent;
                      plVar13 = (plVar9->info).binary.length;
                      plVar20 = (lys_node *)(plVar9->info).dec64.div;
                      dev_target_00[1].parent = (lys_node *)(plVar9->info).lref.target;
                      dev_target_00[1].child = plVar20;
                      dev_target_00[1].module = plVar21;
                      *(lys_restr **)&dev_target_00[1].nodetype = plVar13;
                      dev_target_00[1].ext = pplVar11;
                      dev_target_00[1].iffeature = (lys_iffeature *)plVar12;
                      dev_target_00[1].ref = pcVar23;
                      dev_target_00[1].flags = (short)(undefined4)uVar10;
                      dev_target_00[1].ext_size = (char)((ulong)uVar10 >> 0x10);
                      dev_target_00[1].iffeature_size = (char)((ulong)uVar10 >> 0x18);
                      dev_target_00[1].padding[0] = (char)((ulong)uVar10 >> 0x20);
                      dev_target_00[1].padding[1] = (char)((ulong)uVar10 >> 0x28);
                      dev_target_00[1].padding[2] = (char)((ulong)uVar10 >> 0x30);
                      dev_target_00[1].padding[3] = (char)((ulong)uVar10 >> 0x38);
                      free((lys_type *)local_38->iffeature);
                      plVar24->iffeature = (lys_iffeature *)local_80;
                      dev_target_00[1].module = local_60;
                      iVar17 = yang_fill_type(module,local_80,
                                              (yang_type *)dev_target_00[1].iffeature,local_60,
                                              local_40);
                      if ((iVar17 == 0) &&
                         (iVar17 = unres_schema_add_node
                                             (module,local_40,(lys_type *)plVar24->iffeature,
                                              UNRES_TYPE_DER,dev_target_00), plVar24 = local_38,
                         iVar17 != -1)) goto LAB_00152120;
                    }
                    else {
                      ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"type");
                      ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                              "Target node does not allow \"type\" property.");
                      plVar24 = local_38;
                    }
                    goto LAB_001523d8;
                  }
LAB_00152120:
                  pcVar23 = local_68 + 1;
                  plVar20 = dev_target;
                } while (pcVar23 < (char *)(ulong)*(byte *)&dev_target->ext);
              }
              plVar26 = local_48;
              if (local_48->number != 0) {
                plVar21 = (lys_module *)0x0;
                do {
                  plVar20 = (plVar26->set).s[(long)plVar21];
                  local_68 = plVar20->name;
                  if (plVar20->nodetype == 4) {
                    plVar24 = plVar20[1].prev;
                    iVar17 = unres_schema_add_node
                                       (module,local_40,&plVar20[1].ref,UNRES_TYPE_DFLT,
                                        (lys_node *)&plVar20[1].prev);
                    bVar31 = iVar17 == -1;
                    plVar26 = local_48;
                  }
                  else if (plVar20->padding[2] == '\0') {
                    plVar24 = (lys_node *)0x0;
                    bVar31 = false;
                  }
                  else {
                    dev_target = (lys_node *)&plVar20[1].ref;
                    lVar28 = 0;
                    uVar25 = 0;
                    local_60 = plVar21;
                    local_38 = plVar20;
                    do {
                      iVar17 = unres_schema_add_node
                                         (module,local_40,dev_target,UNRES_TYPE_DFLT,
                                          (lys_node *)((local_38[1].prev)->padding + lVar28 + -0x1c)
                                         );
                      plVar26 = local_48;
                      plVar21 = local_60;
                      if (iVar17 == -1) {
                        plVar24 = *(lys_node **)((local_38[1].prev)->padding + lVar28 + -0x1c);
                        bVar31 = true;
                        goto LAB_0015220d;
                      }
                      uVar25 = uVar25 + 1;
                      lVar28 = lVar28 + 8;
                    } while (uVar25 < local_38->padding[2]);
                    plVar24 = (lys_node *)0x0;
                    bVar31 = false;
                  }
LAB_0015220d:
                  if (bVar31) {
                    ly_vlog(LYE_INARG,LY_VLOG_NONE,(void *)0x0,plVar24,"default");
                    ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                            "The default value \"%s\" of the deviated node \"%s\"no longer matches its type."
                            ,local_68);
                    goto LAB_00152412;
                  }
                  plVar21 = (lys_module *)((long)&plVar21->ctx + 1);
                } while (plVar21 < (lys_module *)(ulong)plVar26->number);
              }
              ly_set_free(plVar26);
              for (plVar20 = local_58; plVar20 != (lys_node *)0x0; plVar20 = lys_parent(plVar20)) {
                plVar21 = lys_node_module(plVar20);
                if (plVar21 != module) {
                  plVar21->field_0x40 = plVar21->field_0x40 & 0xcf | 0x10;
                  lys_set_implemented(plVar21);
                }
              }
              uVar25 = local_78 + 1;
            } while (uVar25 != uVar29);
          }
          if (uVar27 == 0) {
            return 0;
          }
          local_38 = (lys_node *)(uVar27 * 0x68);
          plVar20 = (lys_node *)0x0;
          while( true ) {
            puVar15 = local_40;
            module->augment_size = module->augment_size + '\x01';
            iVar17 = yang_check_augment(module,(lys_node_augment *)
                                               (plVar20->padding +
                                               (long)(module->augment->padding + -0x38)),0,local_40)
            ;
            if ((iVar17 != 0) ||
               (iVar17 = unres_schema_add_node
                                   (module,puVar15,
                                    plVar20->padding + (long)(module->augment->padding + -0x38),
                                    UNRES_AUGMENT,(lys_node *)0x0), iVar17 == -1)) break;
            plVar20 = plVar20 + 1;
            if (local_38 == plVar20) {
              return 0;
            }
          }
LAB_0015241a:
          bVar14 = true;
          bVar31 = true;
        }
        else {
          bVar14 = true;
        }
        goto LAB_00151b43;
      }
      bVar31 = true;
    }
    else {
LAB_00151b3e:
      bVar31 = false;
    }
    bVar14 = false;
  }
LAB_00151b43:
  if (!bVar31) {
    yang_free_ident_base(module->ident,0,(uint)module->ident_size);
  }
  if (!bVar14) {
    yang_free_nodes(module->ctx,local_70);
  }
  bVar3 = module->augment_size;
  if (bVar3 < bVar1) {
    lVar30 = (ulong)bVar3 * 0x68;
    lVar28 = uVar27 - bVar3;
    do {
      yang_free_augment(module->ctx,(lys_node_augment *)(module->augment->padding + lVar30 + -0x1c))
      ;
      lVar30 = lVar30 + 0x68;
      lVar28 = lVar28 + -1;
    } while (lVar28 != 0);
  }
  bVar1 = module->deviation_size;
  if (bVar1 < bVar2) {
    lVar30 = (ulong)bVar1 * 0x38;
    lVar28 = uVar29 - bVar1;
    do {
      yang_free_deviate(module->ctx,
                        (lys_deviation *)((long)&module->deviation->target_name + lVar30),0);
      free(*(void **)((long)&module->deviation->deviate + lVar30));
      lVar30 = lVar30 + 0x38;
      lVar28 = lVar28 + -1;
    } while (lVar28 != 0);
  }
  return 1;
}

Assistant:

static int
yang_check_sub_module(struct lys_module *module, struct unres_schema *unres, struct lys_node *node)
{
    uint i, erase_identities = 1, erase_nodes = 1, aug_size, dev_size = 0;

    aug_size = module->augment_size;
    module->augment_size = 0;
    dev_size = module->deviation_size;
    module->deviation_size = 0;

    if (yang_check_typedef(module, NULL, unres)) {
        goto error;
    }

    if (yang_check_ext_instance(module, &module->ext, module->ext_size, module, unres)) {
        goto error;
    }

    /* check extension in revision */
    for (i = 0; i < module->rev_size; ++i) {
        if (yang_check_ext_instance(module, &module->rev[i].ext, module->rev[i].ext_size, &module->rev[i], unres)) {
            goto error;
        }
    }

    /* check extension in definition of extension */
    for (i = 0; i < module->extensions_size; ++i) {
        if (yang_check_ext_instance(module, &module->extensions[i].ext, module->extensions[i].ext_size, &module->extensions[i], unres)) {
            goto error;
        }
    }

    /* check features */
    for (i = 0; i < module->features_size; ++i) {
        if (yang_check_iffeatures(module, NULL, &module->features[i], FEATURE_KEYWORD, unres)) {
            goto error;
        }
        if (yang_check_ext_instance(module, &module->features[i].ext, module->features[i].ext_size, &module->features[i], unres)) {
            goto error;
        }

        /* check for circular dependencies */
        if (module->features[i].iffeature_size && (unres_schema_add_node(module, unres, &module->features[i], UNRES_FEATURE, NULL) == -1)) {
            goto error;
        }
    }
    erase_identities = 0;
    if (yang_check_identities(module, unres)) {
        goto error;
    }
    erase_nodes = 0;
    if (yang_check_nodes(module, NULL, node, 0, unres)) {
        goto error;
    }

    /* check deviation */
    for (i = 0; i < dev_size; ++i) {
        module->deviation_size++;
        if (yang_check_deviation(module, unres, &module->deviation[i])) {
            goto error;
        }
    }

    /* check augments */
    for (i = 0; i < aug_size; ++i) {
        module->augment_size++;
        if (yang_check_augment(module, &module->augment[i], 0, unres)) {
            goto error;
        }
        if (unres_schema_add_node(module, unres, &module->augment[i], UNRES_AUGMENT, NULL) == -1) {
            goto error;
        }
    }

    return EXIT_SUCCESS;
error:
    if (erase_identities) {
        yang_free_ident_base(module->ident, 0, module->ident_size);
    }
    if (erase_nodes) {
        yang_free_nodes(module->ctx, node);
    }
    for (i = module->augment_size; i < aug_size; ++i) {
        yang_free_augment(module->ctx, &module->augment[i]);
    }
    for (i = module->deviation_size; i < dev_size; ++i) {
        yang_free_deviate(module->ctx, &module->deviation[i], 0);
        free(module->deviation[i].deviate);
    }
    return EXIT_FAILURE;
}